

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.h
# Opt level: O1

void __thiscall chrono::ChLink::ChLink(ChLink *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  ChObj::ChObj((ChObj *)this);
  *(undefined8 *)
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.offset_w = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.offset_L = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.system = (ChSystem *)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined2 *)&(this->super_ChLinkBase).super_ChPhysicsItem.field_0x74 = 0x100;
  (this->super_ChLinkBase).super_ChPhysicsItem.field_0x76 = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_00b3dba0;
  this->Body1 = (ChBodyFrame *)SUB168(ZEXT416(0) << 0x40,0);
  dVar1 = VNULL;
  this->Body2 = (ChBodyFrame *)SUB168(ZEXT416(0) << 0x40,8);
  (this->react_force).m_data[0] = VNULL;
  dVar2 = DAT_00b90ac0;
  (this->react_force).m_data[1] = DAT_00b90ac0;
  dVar3 = DAT_00b90ac8;
  (this->react_force).m_data[2] = DAT_00b90ac8;
  (this->react_torque).m_data[0] = dVar1;
  (this->react_torque).m_data[1] = dVar2;
  (this->react_torque).m_data[2] = dVar3;
  return;
}

Assistant:

virtual ~ChLink() {}